

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O1

double __thiscall FIX::Dictionary::getDouble(Dictionary *this,string *key)

{
  string local_b0;
  double local_90;
  
  getString(&local_b0,this,key,false);
  local_90 = DoubleConvertor::convert(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return local_90;
}

Assistant:

double Dictionary::getDouble( const std::string& key ) const
EXCEPT ( ConfigError, FieldConvertError )
{
  try
  {
    return DoubleConvertor::convert( getString(key) );
  }
  catch ( FieldConvertError& )
  {
    throw ConfigError( "Illegal value " + getString(key) + " for " + key );
  }
}